

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_i2c_setClockDivider(uint16_t divider)

{
  uint32_t *paddr;
  uint16_t divider_local;
  
  bcm2835_peri_write(bcm2835_bsc1 + 5,(uint)divider);
  i2c_byte_wait_us = (int)(((float)divider / 2.5e+08) * 1e+06 * 9.0);
  return;
}

Assistant:

void bcm2835_i2c_setClockDivider(uint16_t divider)
{
#ifdef I2C_V1
    volatile uint32_t* paddr = bcm2835_bsc0 + BCM2835_BSC_DIV/4;
#else
    volatile uint32_t* paddr = bcm2835_bsc1 + BCM2835_BSC_DIV/4;
#endif    
    bcm2835_peri_write(paddr, divider);
    /* Calculate time for transmitting one byte
    // 1000000 = micros seconds in a second
    // 9 = Clocks per byte : 8 bits + ACK
    */
    i2c_byte_wait_us = ((float)divider / BCM2835_CORE_CLK_HZ) * 1000000 * 9;
}